

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

bool __thiscall
Inline::TryGetCallApplyInlineeData
          (Inline *this,FunctionJITTimeInfo *inlinerData,Instr *callInstr,Instr *callApplyLdInstr,
          Instr *callApplyTargetLdInstr,FunctionJITTimeInfo **inlineeData,
          InlineCacheIndex *inlineCacheIndex,Instr **callbackDefInstr,bool isCallInstanceFunction,
          CallApplyTargetSourceType *targetType)

{
  InlineCacheIndex inlineCacheIndex_00;
  Opnd *this_00;
  bool bVar1;
  ProfileId PVar2;
  uint sourceContextId;
  uint functionId;
  ProfiledInstr *pPVar3;
  SymOpnd *this_01;
  PropertySymOpnd *pPVar4;
  FunctionJITTimeInfo *pFVar5;
  JITTimeFunctionBody *this_02;
  
  *callbackDefInstr = (Instr *)0x0;
  if ((callApplyTargetLdInstr->m_opcode == LdFldForCallApplyTarget) &&
     (pPVar3 = IR::Instr::AsProfiledInstr(callApplyTargetLdInstr),
     ((ulong)(pPVar3->u).ldElemInfo & 0x80000) == 0)) {
    this_00 = callApplyTargetLdInstr->m_src1;
    bVar1 = IR::Opnd::IsSymOpnd(this_00);
    if (!bVar1) {
      return false;
    }
    this_01 = IR::Opnd::AsSymOpnd(this_00);
    bVar1 = IR::SymOpnd::IsPropertySymOpnd(this_01);
    if (!bVar1) {
      return false;
    }
    pPVar4 = IR::Opnd::AsPropertySymOpnd(this_00);
    inlineCacheIndex_00 = pPVar4->m_inlineCacheIndex;
    *inlineCacheIndex = inlineCacheIndex_00;
    pFVar5 = FunctionJITTimeInfo::GetLdFldInlinee(inlinerData,inlineCacheIndex_00);
    *inlineeData = pFVar5;
  }
  else {
    pFVar5 = *inlineeData;
  }
  if (pFVar5 != (FunctionJITTimeInfo *)0x0) {
    *targetType = LdFld;
    return true;
  }
  bVar1 = TryGetCallApplyCallbackTargetInlineeData
                    (this,inlinerData,callInstr,callApplyLdInstr,inlineeData,callbackDefInstr,
                     isCallInstanceFunction);
  if (bVar1) {
    *targetType = Callback;
    return true;
  }
  if (!isCallInstanceFunction) {
    sourceContextId = Func::GetSourceContextId(callInstr->m_func);
    functionId = Func::GetLocalFunctionId(callInstr->m_func);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,InlineAnyCallApplyTargetPhase,sourceContextId,
                       functionId);
    if (!bVar1) {
      pPVar3 = IR::Instr::AsProfiledInstr(callInstr);
      PVar2 = (pPVar3->u).field_3.fldInfoData.f1;
      this_02 = Func::GetJITFunctionBody(callInstr->m_func);
      PVar2 = JITTimeFunctionBody::GetCallApplyCallSiteIdForCallSiteId(this_02,PVar2);
      if (PVar2 != 0xffff) {
        pFVar5 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
        pFVar5 = FunctionJITTimeInfo::GetCallApplyTargetInlinee(pFVar5,PVar2);
        *inlineeData = pFVar5;
        goto LAB_0050a14a;
      }
    }
  }
  pFVar5 = *inlineeData;
LAB_0050a14a:
  if (pFVar5 != (FunctionJITTimeInfo *)0x0) {
    *targetType = Other;
  }
  return pFVar5 != (FunctionJITTimeInfo *)0x0;
}

Assistant:

bool
Inline::TryGetCallApplyInlineeData(
    const FunctionJITTimeInfo* inlinerData,
    IR::Instr * callInstr,
    IR::Instr * callApplyLdInstr,
    IR::Instr * callApplyTargetLdInstr,
    const FunctionJITTimeInfo ** inlineeData,
    Js::InlineCacheIndex * inlineCacheIndex,
    IR::Instr ** callbackDefInstr,
    bool isCallInstanceFunction,
    CallApplyTargetSourceType* targetType
    )
{
    *callbackDefInstr = nullptr;

    if (callApplyTargetLdInstr->m_opcode == Js::OpCode::LdFldForCallApplyTarget &&
        ((callApplyTargetLdInstr->AsProfiledInstr()->u.FldInfo().flags & Js::FldInfo_FromAccessor) == 0))
    {
        IR::Opnd *callTargetLdOpnd = callApplyTargetLdInstr->GetSrc1();
        if (!callTargetLdOpnd->IsSymOpnd() || !callTargetLdOpnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            return false;
        }

        *inlineCacheIndex = callTargetLdOpnd->AsPropertySymOpnd()->m_inlineCacheIndex;
        *inlineeData = inlinerData->GetLdFldInlinee(*inlineCacheIndex);
    }

    if (*inlineeData)
    {
        *targetType = CallApplyTargetSourceType::LdFld;
        return true;
    }

    if (TryGetCallApplyCallbackTargetInlineeData(inlinerData, callInstr, callApplyLdInstr, inlineeData, callbackDefInstr, isCallInstanceFunction))
    {
        *targetType = CallApplyTargetSourceType::Callback;
        return true;
    }

    if (!isCallInstanceFunction && !PHASE_OFF(Js::InlineAnyCallApplyTargetPhase, callInstr->m_func))
    {
        Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);
        Js::ProfileId callApplyCallSiteId = callInstr->m_func->GetJITFunctionBody()->GetCallApplyCallSiteIdForCallSiteId(callSiteId);

        if (callApplyCallSiteId != Js::Constants::NoProfileId)
        {
            *inlineeData = callInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallApplyTargetInlinee(callApplyCallSiteId);
        }
    }
    if (*inlineeData)
    {
        *targetType = CallApplyTargetSourceType::Other;
    }
    return *inlineeData != nullptr;
}